

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

int __thiscall QtMWidgets::Picker::findData(Picker *this,QVariant *data,int role,MatchFlags flags)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  Data *pDVar3;
  undefined8 uVar4;
  iterator iVar5;
  int iVar6;
  QModelIndexList result;
  QModelIndex start;
  QList<QModelIndex> local_88;
  QModelIndex local_68;
  undefined1 local_48 [24];
  
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (QModelIndex *)0x0;
  local_88.d.size = 0;
  pPVar1 = (this->d).d;
  pQVar2 = pPVar1->model;
  iVar6 = pPVar1->modelColumn;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&pPVar1->root);
  (**(code **)(*(long *)pQVar2 + 0x60))(local_48,pQVar2,0,iVar6,&local_68);
  pQVar2 = ((this->d).d)->model;
  (**(code **)(*(long *)pQVar2 + 0x150))(&local_68,pQVar2,local_48,role,data,1,flags.i);
  local_88.d.size = (qsizetype)local_68.m;
  local_88.d.ptr = (QModelIndex *)local_68.i;
  uVar4 = local_68._0_8_;
  pDVar3 = local_88.d.d;
  local_68._0_8_ = (QArrayData *)0x0;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  local_88.d.d = (Data *)uVar4;
  if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,0x18,8);
    }
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,0x18,8);
    }
  }
  if ((QAbstractItemModel *)local_88.d.size == (QAbstractItemModel *)0x0) {
    iVar6 = -1;
  }
  else {
    iVar5 = QList<QModelIndex>::begin(&local_88);
    iVar6 = (iVar5.i)->r;
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,0x18,8);
    }
  }
  return iVar6;
}

Assistant:

int
Picker::findData( const QVariant & data, int role, Qt::MatchFlags flags ) const
{
	QModelIndexList result;

	QModelIndex start = d->model->index( 0, d->modelColumn, d->root );

	result = d->model->match( start, role, data, 1, flags );

	if( result.isEmpty() )
		return -1;

	return result.first().row();
}